

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward_int8_x86
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  undefined8 uVar2;
  Allocator *pAVar3;
  _func_int **pp_Var4;
  Layer *pLVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  int *piVar15;
  float *pfVar16;
  Mat *top_blob_00;
  int iVar17;
  size_t totalsize;
  long lVar18;
  ulong uVar19;
  Option *opt_00;
  int iVar20;
  _func_int *p_Var21;
  long lVar22;
  long lVar23;
  Mat bottom_blob_int8_g;
  Mat bottom_blob_bordered;
  Option opt_g;
  float scale_out;
  undefined1 local_208 [40];
  undefined1 local_1e0 [16];
  size_t local_1d0;
  Option *local_1c0;
  undefined1 local_1b8 [44];
  int iStack_18c;
  int iStack_188;
  int iStack_184;
  ulong local_180;
  undefined1 local_178 [44];
  int iStack_14c;
  int local_148;
  int iStack_144;
  size_t sStack_140;
  long local_138;
  uint local_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined1 local_118 [40];
  undefined1 local_f0 [16];
  ulong local_e0;
  Mat *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  Allocator *pAStack_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined8 local_98;
  vector<float,_std::allocator<float>_> local_90;
  vector<float,_std::allocator<float>_> local_78;
  vector<float,_std::allocator<float>_> local_60;
  vector<float,_std::allocator<float>_> local_48;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined3 uVar11;
  undefined1 uVar12;
  undefined2 uVar13;
  undefined1 uVar14;
  
  local_128._0_4_ = bottom_blob->h;
  local_128._4_4_ = bottom_blob->c;
  local_1b8._16_8_ = bottom_blob->elemsize;
  p_Var21 = this->_vptr_ConvolutionDepthWise_x86[-3];
  local_12c = (*(int *)(&this->field_0xbc + (long)p_Var21) + -1) *
              *(int *)(&this->field_0xc4 + (long)p_Var21);
  local_138 = CONCAT44(local_138._4_4_,
                       (*(int *)(&this->field_0xc0 + (long)p_Var21) + -1) *
                       *(int *)(&this->field_0xc8 + (long)p_Var21));
  local_1b8._0_8_ = bottom_blob->data;
  local_1b8._8_8_ = bottom_blob->refcount;
  local_1b8._24_4_ = bottom_blob->elempack;
  local_1b8._32_8_ = bottom_blob->allocator;
  uVar2._0_4_ = bottom_blob->dims;
  uVar2._4_4_ = bottom_blob->w;
  local_1b8._40_4_ = bottom_blob->dims;
  iStack_18c = bottom_blob->w;
  iStack_188 = bottom_blob->h;
  iStack_184 = bottom_blob->c;
  uStack_120 = 0;
  local_180 = bottom_blob->cstep;
  if ((int *)local_1b8._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_1b8._8_8_ = *(int *)local_1b8._8_8_ + 1;
    UNLOCK();
  }
  local_1c0 = opt;
  local_d0 = top_blob;
  if ((pointer)local_1b8._16_8_ != (pointer)0x1) {
    pAVar3 = opt->workspace_allocator;
    auVar6._4_4_ = 0xffffffff;
    auVar6._0_4_ = -(uint)((undefined4)uVar2 == 3);
    auVar6._8_4_ = 0xffffffff;
    auVar6._12_4_ = 0xffffffff;
    iVar17 = movmskps(local_1b8._8_4_,auVar6);
    if ((((iVar17 != 0xf) || (local_1b8._24_4_ != 1)) || ((Allocator *)local_1b8._32_8_ != pAVar3))
       || ((pointer)local_1b8._16_8_ != (pointer)0x1)) {
      if ((int *)local_1b8._8_8_ != (int *)0x0) {
        LOCK();
        *(int *)local_1b8._8_8_ = *(int *)local_1b8._8_8_ + -1;
        UNLOCK();
        if (*(int *)local_1b8._8_8_ == 0) {
          if ((Allocator *)local_1b8._32_8_ == (Allocator *)0x0) {
            if ((void *)local_1b8._0_8_ != (void *)0x0) {
              uStack_c0 = 0;
              local_c8 = uVar2;
              free((void *)local_1b8._0_8_);
              uVar2._4_4_ = local_c8._4_4_;
            }
          }
          else {
            uStack_c0 = 0;
            local_c8 = uVar2;
            (**(code **)(*(long *)local_1b8._32_8_ + 0x18))();
            uVar2._4_4_ = local_c8._4_4_;
          }
        }
      }
      local_1b8._0_8_ = (void *)0x0;
      local_1b8._8_4_ = 0;
      local_1b8._12_4_ = 0;
      local_1b8._8_8_ = (int *)0x0;
      local_1b8._16_8_ = (pointer)0x1;
      local_1b8._24_4_ = 1;
      iStack_18c = uVar2._4_4_;
      local_1b8._40_4_ = 3;
      iStack_188 = (int)local_128;
      iStack_184 = local_128._4_4_;
      local_180 = (long)((int)local_128 * uVar2._4_4_) + 0xfU & 0xfffffffffffffff0;
      uVar19 = (long)local_128._4_4_ * local_180;
      local_1b8._32_8_ = pAVar3;
      if (uVar19 != 0) {
        if (pAVar3 == (Allocator *)0x0) {
          local_178._0_8_ = (void *)0x0;
          uVar2._4_4_ = posix_memalign((void **)local_178,0x10,uVar19 | 4);
          local_1b8._0_8_ = local_178._0_8_;
          if (uVar2._4_4_ != 0) {
            local_178._0_8_ = (void *)0x0;
            local_1b8._0_8_ = local_178._0_8_;
          }
        }
        else {
          local_1b8._0_8_ = (**(code **)(*(long *)pAVar3 + 0x10))(pAVar3,uVar19 | 4);
        }
        local_1b8._8_8_ = local_1b8._0_8_ + uVar19;
        *(undefined4 *)(local_1b8._0_8_ + uVar19) = 1;
      }
    }
    uVar2._4_4_ = -100;
    local_208._8_8_ = (float *)CONCAT44(local_208._12_4_,local_208._8_4_);
    if (((void *)local_1b8._0_8_ == (void *)0x0) ||
       (local_208._8_8_ = (float *)CONCAT44(local_208._12_4_,local_208._8_4_),
       (long)iStack_184 * local_180 == 0)) goto LAB_0015b387;
    pp_Var4 = this->_vptr_ConvolutionDepthWise_x86;
    uVar2._4_4_ = local_128._4_4_ / *(int *)(&this->field_0xf0 + (long)pp_Var4[-3]);
    if (0 < *(int *)(&this->field_0xf0 + (long)pp_Var4[-3])) {
      lVar22 = 0;
      lVar18 = 0;
      do {
        uVar7._0_1_ = local_1c0->lightmode;
        uVar7._1_3_ = *(undefined3 *)&local_1c0->field_0x1;
        uVar7._4_4_ = local_1c0->num_threads;
        local_118._16_8_ = local_1c0->workspace_allocator;
        uVar8._0_1_ = local_1c0->use_winograd_convolution;
        uVar8._1_1_ = local_1c0->use_sgemm_convolution;
        uVar8._2_1_ = local_1c0->use_int8_inference;
        uVar8._3_1_ = local_1c0->use_vulkan_compute;
        uVar9 = local_1c0->use_fp16_packed;
        uVar10 = local_1c0->use_fp16_storage;
        uVar12 = local_1c0->use_fp16_arithmetic;
        uVar14 = local_1c0->use_int8_storage;
        uVar13 = CONCAT11(uVar14,uVar12);
        uVar11 = CONCAT21(uVar13,uVar10);
        uVar8._4_4_ = CONCAT31(uVar11,uVar9);
        local_118._0_4_ = (undefined4)uVar7;
        local_118._32_8_ = *(undefined8 *)&local_1c0->use_int8_arithmetic;
        local_118._24_4_ = (undefined4)uVar8;
        local_118._4_4_ = 1;
        local_118._8_4_ = (undefined4)local_1b8._32_8_;
        local_118._12_4_ = SUB84(local_1b8._32_8_,4);
        uVar19 = bottom_blob->elemsize;
        local_178._0_8_ = bottom_blob->cstep * lVar22 * uVar19 + (long)bottom_blob->data;
        local_178._24_4_ = bottom_blob->elempack;
        local_178._32_8_ = bottom_blob->allocator;
        local_178._8_4_ = 0;
        local_178._12_4_ = 0;
        local_178._16_4_ = (undefined4)uVar19;
        local_178._20_4_ = (undefined4)(uVar19 >> 0x20);
        iStack_14c = bottom_blob->w;
        local_178._40_4_ = 3;
        local_148 = bottom_blob->h;
        iStack_144 = uVar2._4_4_;
        sStack_140 = ((long)(bottom_blob->h * bottom_blob->w) * uVar19 + 0xf & 0xfffffffffffffff0) /
                     uVar19;
        local_208._0_8_ = local_180 * lVar22 * local_1b8._16_8_ + local_1b8._0_8_;
        local_208._8_4_ = 0;
        local_208._12_4_ = 0;
        local_208._16_8_ = local_1b8._16_8_;
        local_208._24_4_ = local_1b8._24_4_;
        local_208._32_8_ = local_1b8._32_8_;
        local_1e0._4_4_ = iStack_18c;
        local_1e0._0_4_ = 3;
        local_1e0._8_4_ = iStack_188;
        local_1e0._12_4_ = uVar2._4_4_;
        local_1d0 = ((long)(iStack_188 * iStack_18c) * local_1b8._16_8_ + 0xfU & 0xfffffffffffffff0)
                    / (ulong)local_1b8._16_8_;
        local_118._28_4_ = uVar8._4_4_;
        quantize_float32_to_int8
                  ((Mat *)local_178,(Mat *)local_208,
                   *(float *)(*(long *)(&this->field_0x200 + (long)pp_Var4[-3]) + lVar18 * 4),
                   (Option *)local_118);
        piVar15 = (int *)CONCAT44(local_208._12_4_,local_208._8_4_);
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + -1;
          UNLOCK();
          if (*piVar15 == 0) {
            if ((Allocator *)local_208._32_8_ == (Allocator *)0x0) {
              if ((pointer)local_208._0_8_ != (pointer)0x0) {
                free((void *)local_208._0_8_);
              }
            }
            else {
              (**(code **)(*(long *)local_208._32_8_ + 0x18))();
            }
          }
        }
        local_208._16_8_ = (float *)0x0;
        local_208._24_4_ = 0;
        local_208._0_8_ = (pointer)0x0;
        local_208._8_4_ = 0;
        local_208._12_4_ = 0;
        local_1e0 = (undefined1  [16])0x0;
        local_1d0 = 0;
        piVar15 = (int *)CONCAT44(local_178._12_4_,local_178._8_4_);
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + -1;
          UNLOCK();
          if (*piVar15 == 0) {
            if ((Allocator *)local_178._32_8_ == (Allocator *)0x0) {
              if ((void *)local_178._0_8_ != (void *)0x0) {
                free((void *)local_178._0_8_);
              }
            }
            else {
              (**(code **)(*(long *)local_178._32_8_ + 0x18))();
            }
          }
        }
        lVar18 = lVar18 + 1;
        pp_Var4 = this->_vptr_ConvolutionDepthWise_x86;
        lVar22 = lVar22 + uVar2._4_4_;
      } while (lVar18 < *(int *)(&this->field_0xf0 + (long)pp_Var4[-3]));
    }
  }
  local_178._16_4_ = 0;
  local_178._20_4_ = 0;
  local_178._24_4_ = 0;
  local_178._0_8_ = (void *)0x0;
  local_178._8_4_ = 0;
  local_178._12_4_ = 0;
  local_178._32_8_ = (Allocator *)0x0;
  stack0xfffffffffffffeb0 = ZEXT816(0);
  sStack_140 = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86 +
             (long)this->_vptr_ConvolutionDepthWise_x86[-3]),(Mat *)local_1b8,(Mat *)local_178,
             local_1c0);
  top_blob_00 = local_d0;
  uVar2._4_4_ = -100;
  local_208._8_8_ = (float *)CONCAT44(local_208._12_4_,local_208._8_4_);
  if (((void *)local_178._0_8_ != (void *)0x0) &&
     (local_208._8_8_ = (float *)CONCAT44(local_208._12_4_,local_208._8_4_),
     (long)iStack_144 * sStack_140 != 0)) {
    p_Var21 = this->_vptr_ConvolutionDepthWise_x86[-3];
    opt_00 = (Option *)local_1c0->blob_allocator;
    Mat::create(local_d0,(int)(~local_12c + iStack_14c) /
                         *(int *)(&this->field_0xcc + (long)p_Var21) + 1,
                (int)(~(uint)local_138 + local_148) / *(int *)(&this->field_0xd0 + (long)p_Var21) +
                1,*(int *)(&this->field_0xb8 + (long)p_Var21),
                ((ulong)(byte)(&this->field_0x244)[(long)p_Var21] ^ 1) * 3 + 1,(Allocator *)opt_00);
    pfVar16 = (float *)CONCAT44(local_208._12_4_,local_208._8_4_);
    local_208._8_8_ = pfVar16;
    if ((top_blob_00->data != (void *)0x0) && ((long)top_blob_00->c * top_blob_00->cstep != 0)) {
      p_Var21 = this->_vptr_ConvolutionDepthWise_x86[-3];
      uVar2._4_4_ = local_128._4_4_;
      local_208._8_8_ = (float *)CONCAT44(local_208._12_4_,local_208._8_4_);
      if ((local_128._4_4_ == *(int *)(&this->field_0xf0 + (long)p_Var21)) &&
         (local_208._8_8_ = pfVar16,
         *(int *)(&this->field_0xf0 + (long)p_Var21) == *(int *)(&this->field_0xb8 + (long)p_Var21))
         ) {
        if ((&this->field_0x244)[(long)p_Var21] == '\x01') {
          local_208._0_8_ = (pointer)0x0;
          local_208._8_8_ = (float *)0x0;
          local_208._16_8_ = (float *)0x0;
          p_Var21 = (_func_int *)
                    ((long)&this->_vptr_ConvolutionDepthWise_x86 +
                    (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
          if (0 < *(int *)(&this->field_0xf0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])) {
            lVar18 = 0;
            local_208._8_8_ = (float *)0x0;
            do {
              fVar1 = *(float *)(*(long *)(p_Var21 + 0x1c0) + lVar18 * 4);
              local_118._0_4_ = 0.0;
              if (fVar1 != 0.0) {
                local_118._0_4_ =
                     1.0 / (fVar1 * *(float *)(*(long *)(p_Var21 + 0x200) + lVar18 * 4));
              }
              local_b8 = CONCAT44(local_b8._4_4_,*(undefined4 *)(p_Var21 + 0x240));
              if (local_208._8_8_ == local_208._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_208,
                           (iterator)local_208._8_8_,(float *)local_118);
              }
              else {
                *(undefined4 *)local_208._8_8_ = local_118._0_4_;
                local_208._8_8_ = local_208._8_8_ + 4;
              }
              if (local_208._8_8_ == local_208._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_208,
                           (iterator)local_208._8_8_,(float *)&local_b8);
              }
              else {
                *(float *)local_208._8_8_ = (float)local_b8;
                local_208._8_8_ = local_208._8_8_ + 4;
              }
              lVar18 = lVar18 + 1;
              p_Var21 = (_func_int *)
                        ((long)&this->_vptr_ConvolutionDepthWise_x86 +
                        (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
            } while (lVar18 < *(int *)(&this->field_0xf0 +
                                      (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
          }
          if (*(int *)(p_Var21 + 0xbc) != 3) {
LAB_0015b097:
            if ((pointer)local_208._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_208._0_8_,local_208._16_8_ - local_208._0_8_);
            }
            goto LAB_0015b0ad;
          }
          if ((((*(int *)(p_Var21 + 0xc0) == 3) && (*(int *)(p_Var21 + 0xc4) == 1)) &&
              (*(int *)(p_Var21 + 200) == 1)) &&
             ((*(int *)(p_Var21 + 0xcc) == 1 && (*(int *)(p_Var21 + 0xd0) == 1)))) {
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_48,(vector<float,_std::allocator<float>_> *)local_208);
            convdw3x3s1_int8_requant_sse
                      ((Mat *)local_178,top_blob_00,(Mat *)(p_Var21 + 0x140),
                       (Mat *)(p_Var21 + 0x180),&local_48,opt_00);
            local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
          else {
            if (((*(int *)(p_Var21 + 0xc0) != 3) ||
                ((*(int *)(p_Var21 + 0xc4) != 1 || (*(int *)(p_Var21 + 200) != 1)))) ||
               ((*(int *)(p_Var21 + 0xcc) != 2 || (*(int *)(p_Var21 + 0xd0) != 2))))
            goto LAB_0015b097;
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_60,(vector<float,_std::allocator<float>_> *)local_208);
            convdw3x3s2_int8_requant_sse
                      ((Mat *)local_178,top_blob_00,(Mat *)(p_Var21 + 0x140),
                       (Mat *)(p_Var21 + 0x180),&local_60,opt_00);
          }
          if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage -
                            (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start);
          }
          pLVar5 = this->activation;
          if (pLVar5 != (Layer *)0x0) {
            (*pLVar5->_vptr_Layer[9])(pLVar5,top_blob_00,local_1c0);
          }
        }
        else {
          local_208._0_8_ = (pointer)0x0;
          local_208._8_8_ = (float *)0x0;
          local_208._16_8_ = (float *)0x0;
          p_Var21 = (_func_int *)
                    ((long)&this->_vptr_ConvolutionDepthWise_x86 +
                    (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
          if (0 < *(int *)(&this->field_0xf0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])) {
            lVar18 = 0;
            local_208._8_8_ = (float *)0x0;
            do {
              local_118._0_4_ =
                   1.0 / (*(float *)(*(long *)(p_Var21 + 0x1c0) + lVar18 * 4) *
                         *(float *)(*(long *)(p_Var21 + 0x200) + lVar18 * 4));
              if (local_208._8_8_ == local_208._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_208,
                           (iterator)local_208._8_8_,(float *)local_118);
              }
              else {
                *(undefined4 *)local_208._8_8_ = local_118._0_4_;
                local_208._8_8_ = local_208._8_8_ + 4;
              }
              lVar18 = lVar18 + 1;
              p_Var21 = (_func_int *)
                        ((long)&this->_vptr_ConvolutionDepthWise_x86 +
                        (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
            } while (lVar18 < *(int *)(&this->field_0xf0 +
                                      (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
          }
          if (*(int *)(p_Var21 + 0xbc) != 3) goto LAB_0015b097;
          if ((((*(int *)(p_Var21 + 0xc0) == 3) && (*(int *)(p_Var21 + 0xcc) == 1)) &&
              (*(int *)(p_Var21 + 0xd0) == 1)) &&
             ((*(int *)(p_Var21 + 0xc4) == 1 && (*(int *)(p_Var21 + 200) == 1)))) {
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_78,(vector<float,_std::allocator<float>_> *)local_208);
            convdw3x3s1_int8_dequant_sse
                      ((Mat *)local_178,top_blob_00,(Mat *)(p_Var21 + 0x140),
                       (Mat *)(p_Var21 + 0x180),&local_78,opt_00);
            local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
          else {
            if ((((*(int *)(p_Var21 + 0xc0) != 3) ||
                 ((*(int *)(p_Var21 + 0xcc) != 2 || (*(int *)(p_Var21 + 0xd0) != 2)))) ||
                (*(int *)(p_Var21 + 0xc4) != 1)) || (*(int *)(p_Var21 + 200) != 1))
            goto LAB_0015b097;
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_90,(vector<float,_std::allocator<float>_> *)local_208);
            convdw3x3s2_int8_dequant_sse
                      ((Mat *)local_178,top_blob_00,(Mat *)(p_Var21 + 0x140),
                       (Mat *)(p_Var21 + 0x180),&local_90,opt_00);
          }
          if (local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage -
                            (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start);
          }
          pLVar5 = this->activation;
          if (pLVar5 != (Layer *)0x0) {
            (*pLVar5->_vptr_Layer[9])(pLVar5,top_blob_00,local_1c0);
          }
        }
        if ((pointer)local_208._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_208._0_8_,local_208._16_8_ - local_208._0_8_);
        }
      }
      else {
LAB_0015b0ad:
        iVar17 = *(int *)(&this->field_0xf0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
        iVar20 = *(int *)(&this->field_0xb8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) /
                 iVar17;
        if (0 < iVar17) {
          local_128 = (long)(uVar2._4_4_ / iVar17);
          local_138 = (long)iVar20;
          lVar18 = 0;
          lVar22 = 0;
          lVar23 = 0;
          do {
            local_208._16_8_ = CONCAT44(local_178._20_4_,local_178._16_4_);
            local_208._0_8_ = sStack_140 * lVar18 * local_208._16_8_ + local_178._0_8_;
            local_208._8_4_ = 0;
            local_208._12_4_ = 0;
            local_208._24_4_ = local_178._24_4_;
            local_208._32_8_ = local_178._32_8_;
            local_1e0._4_4_ = iStack_14c;
            local_1e0._0_4_ = 3;
            local_1e0._8_4_ = local_148;
            local_1e0._12_4_ = uVar2._4_4_ / iVar17;
            local_1d0 = ((long)(local_148 * iStack_14c) * local_208._16_8_ + 0xfU &
                        0xfffffffffffffff0) / (ulong)local_208._16_8_;
            local_118._16_8_ = local_d0->elemsize;
            local_118._0_8_ = local_d0->cstep * lVar22 * local_118._16_8_ + (long)local_d0->data;
            local_118._24_4_ = local_d0->elempack;
            local_118._32_8_ = local_d0->allocator;
            local_118._8_4_ = 0;
            local_118._12_4_ = 0;
            local_f0._4_4_ = local_d0->w;
            local_f0._0_4_ = 3;
            local_f0._8_4_ = local_d0->h;
            local_f0._12_4_ = iVar20;
            local_e0 = ((long)(local_d0->h * local_d0->w) * local_118._16_8_ + 0xfU &
                       0xfffffffffffffff0) / (ulong)local_118._16_8_;
            pLVar5 = (this->group_ops).
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar23];
            local_b8._0_1_ = local_1c0->lightmode;
            local_b8._1_3_ = *(undefined3 *)&local_1c0->field_0x1;
            local_b8._4_4_ = local_1c0->num_threads;
            local_a8 = *(undefined4 *)&local_1c0->workspace_allocator;
            uStack_a4 = *(undefined4 *)((long)&local_1c0->workspace_allocator + 4);
            uStack_a0._0_1_ = local_1c0->use_winograd_convolution;
            uStack_a0._1_1_ = local_1c0->use_sgemm_convolution;
            uStack_a0._2_1_ = local_1c0->use_int8_inference;
            uStack_a0._3_1_ = local_1c0->use_vulkan_compute;
            uStack_9c._0_1_ = local_1c0->use_fp16_packed;
            uStack_9c._1_1_ = local_1c0->use_fp16_storage;
            uStack_9c._2_1_ = local_1c0->use_fp16_arithmetic;
            uStack_9c._3_1_ = local_1c0->use_int8_storage;
            local_98._0_1_ = local_1c0->use_int8_arithmetic;
            local_98._1_1_ = local_1c0->use_packing_layout;
            local_98._2_1_ = local_1c0->use_shader_pack8;
            local_98._3_1_ = local_1c0->use_bf16_storage;
            local_98._4_4_ = *(undefined4 *)&local_1c0->field_0x24;
            pAStack_b0 = (Allocator *)local_118._32_8_;
            (*pLVar5->_vptr_Layer[7])(pLVar5,local_208,local_118,&local_b8);
            piVar15 = (int *)CONCAT44(local_118._12_4_,local_118._8_4_);
            if (piVar15 != (int *)0x0) {
              LOCK();
              *piVar15 = *piVar15 + -1;
              UNLOCK();
              if (*piVar15 == 0) {
                if ((Allocator *)local_118._32_8_ == (Allocator *)0x0) {
                  if ((void *)local_118._0_8_ != (void *)0x0) {
                    free((void *)local_118._0_8_);
                  }
                }
                else {
                  (**(code **)(*(long *)local_118._32_8_ + 0x18))();
                }
              }
            }
            local_118._16_8_ = (Allocator *)0x0;
            local_118[0x18] = false;
            local_118[0x19] = false;
            local_118[0x1a] = false;
            local_118[0x1b] = false;
            local_118._0_4_ = 0.0;
            local_118._4_4_ = 0;
            local_118._8_4_ = 0;
            local_118._12_4_ = 0;
            local_f0 = (undefined1  [16])0x0;
            local_e0 = 0;
            piVar15 = (int *)CONCAT44(local_208._12_4_,local_208._8_4_);
            if (piVar15 != (int *)0x0) {
              LOCK();
              *piVar15 = *piVar15 + -1;
              UNLOCK();
              if (*piVar15 == 0) {
                if ((Allocator *)local_208._32_8_ == (Allocator *)0x0) {
                  if ((pointer)local_208._0_8_ != (pointer)0x0) {
                    free((void *)local_208._0_8_);
                  }
                }
                else {
                  (**(code **)(*(long *)local_208._32_8_ + 0x18))();
                }
              }
            }
            local_208._16_8_ = (float *)0x0;
            local_208._24_4_ = 0;
            local_208._0_8_ = (pointer)0x0;
            local_208._8_8_ = (float *)0x0;
            local_1e0 = (undefined1  [16])0x0;
            local_1d0 = 0;
            lVar23 = lVar23 + 1;
            lVar22 = lVar22 + local_138;
            lVar18 = lVar18 + local_128;
          } while (lVar23 < *(int *)(&this->field_0xf0 +
                                    (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
        }
      }
      uVar2._4_4_ = 0;
    }
  }
  piVar15 = (int *)CONCAT44(local_178._12_4_,local_178._8_4_);
  if (piVar15 != (int *)0x0) {
    LOCK();
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 == 0) {
      if ((Allocator *)local_178._32_8_ == (Allocator *)0x0) {
        if ((void *)local_178._0_8_ != (void *)0x0) {
          free((void *)local_178._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)local_178._32_8_ + 0x18))();
      }
    }
  }
LAB_0015b387:
  if ((int *)local_1b8._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_1b8._8_8_ = *(int *)local_1b8._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_1b8._8_8_ == 0) {
      if ((Allocator *)local_1b8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_1b8._0_8_ != (void *)0x0) {
          free((void *)local_1b8._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)local_1b8._32_8_ + 0x18))();
      }
    }
  }
  return uVar2._4_4_;
}

Assistant:

int ConvolutionDepthWise_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (elemsize != 1)
    {
        bottom_blob_unbordered.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_unbordered.empty())
            return -100;

        const int channels_g = channels / group;

        // quantize, scale and round to nearest
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = bottom_blob_unbordered.allocator;

            const Mat bottom_blob_g = bottom_blob.channel_range(channels_g * g, channels_g);
            Mat bottom_blob_int8_g = bottom_blob_unbordered.channel_range(channels_g * g, channels_g);

            quantize_float32_to_int8(bottom_blob_g, bottom_blob_int8_g, bottom_blob_int8_scales[g], opt_g);
        }
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_unbordered, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // int8
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        if (use_int8_requantize)
        {
            std::vector<float> requantize_scales;
            for (int g=0; g<group; g++)
            {
                float scale_in;
                if (weight_data_int8_scales[g] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                float scale_out = top_blob_int8_scale;

                requantize_scales.push_back(scale_in);
                requantize_scales.push_back(scale_out);
            }

            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
        else
        {
            std::vector<float> dequantize_scales;
            for (int g=0; g<group; g++)
            {
                float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                dequantize_scales.push_back(top_rescale);
            }

            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1)
            {
                convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2 && dilation_w == 1 && dilation_h == 1)
            {
                convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g=0; g<group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(channels_g * g, channels_g);
        Mat top_blob_g = top_blob.channel_range(num_output_g * g, num_output_g);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    return 0;
}